

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

uint8_t __thiscall wasm::WasmBinaryReader::getLaneIndex(WasmBinaryReader *this,size_t lanes)

{
  byte bVar1;
  string local_40;
  allocator<char> local_19;
  
  bVar1 = getInt8(this);
  if (bVar1 < lanes) {
    return bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Illegal lane index",&local_19);
  throwError(this,&local_40);
}

Assistant:

uint8_t WasmBinaryReader::getLaneIndex(size_t lanes) {
  auto ret = getInt8();
  if (ret >= lanes) {
    throwError("Illegal lane index");
  }
  return ret;
}